

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.cpp
# Opt level: O3

void __thiscall pmx::PmxFrame::Read(PmxFrame *this,istream *stream,PmxSetting *setting)

{
  int iVar1;
  PmxFrameElement *pPVar2;
  uint8_t in_CL;
  PmxFrameElement *pPVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  string local_50;
  
  ReadString_abi_cxx11_(&local_50,(pmx *)stream,(istream *)(ulong)setting->encoding,in_CL);
  std::__cxx11::string::operator=((string *)this,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  ReadString_abi_cxx11_(&local_50,(pmx *)stream,(istream *)(ulong)setting->encoding,in_CL);
  std::__cxx11::string::operator=((string *)&this->frame_english_name,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  std::istream::read((char *)stream,(long)&this->frame_flag);
  std::istream::read((char *)stream,(long)&this->element_count);
  iVar1 = this->element_count;
  lVar5 = (long)iVar1;
  uVar4 = 0xffffffffffffffff;
  if (-1 < lVar5) {
    uVar4 = lVar5 * 8;
  }
  pPVar2 = (PmxFrameElement *)operator_new__(uVar4);
  if (lVar5 != 0) {
    pPVar3 = pPVar2;
    do {
      pPVar3->element_target = '\0';
      pPVar3->index = 0;
      pPVar3 = pPVar3 + 1;
    } while (pPVar3 != pPVar2 + lVar5);
  }
  pPVar3 = (this->elements)._M_t.
           super___uniq_ptr_impl<pmx::PmxFrameElement,_std::default_delete<pmx::PmxFrameElement[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_pmx::PmxFrameElement_*,_std::default_delete<pmx::PmxFrameElement[]>_>
           .super__Head_base<0UL,_pmx::PmxFrameElement_*,_false>._M_head_impl;
  (this->elements)._M_t.
  super___uniq_ptr_impl<pmx::PmxFrameElement,_std::default_delete<pmx::PmxFrameElement[]>_>._M_t.
  super__Tuple_impl<0UL,_pmx::PmxFrameElement_*,_std::default_delete<pmx::PmxFrameElement[]>_>.
  super__Head_base<0UL,_pmx::PmxFrameElement_*,_false>._M_head_impl = pPVar2;
  if (pPVar3 != (PmxFrameElement *)0x0) {
    operator_delete__(pPVar3);
    iVar1 = this->element_count;
  }
  if (0 < iVar1) {
    lVar5 = 0;
    lVar6 = 0;
    do {
      pPVar2 = (this->elements)._M_t.
               super___uniq_ptr_impl<pmx::PmxFrameElement,_std::default_delete<pmx::PmxFrameElement[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_pmx::PmxFrameElement_*,_std::default_delete<pmx::PmxFrameElement[]>_>
               .super__Head_base<0UL,_pmx::PmxFrameElement_*,_false>._M_head_impl;
      std::istream::read((char *)stream,(long)(&pPVar2->element_target + lVar5));
      iVar1 = ReadIndex(stream,(uint)*(byte *)((long)setting +
                                              (6 - (ulong)((&pPVar2->element_target)[lVar5] == '\0')
                                              )));
      *(int *)((long)&pPVar2->index + lVar5) = iVar1;
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 8;
    } while (lVar6 < this->element_count);
  }
  return;
}

Assistant:

void PmxFrame::Read(std::istream *stream, PmxSetting *setting)
	{
		this->frame_name = ReadString(stream, setting->encoding);
		this->frame_english_name = ReadString(stream, setting->encoding);
		stream->read((char*) &this->frame_flag, sizeof(uint8_t));
		stream->read((char*) &this->element_count, sizeof(int));
		this->elements = mmd::make_unique<PmxFrameElement []>(this->element_count);
		for (int i = 0; i < this->element_count; i++)
		{
			this->elements[i].Read(stream, setting);
		}
	}